

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

bool __thiscall
Fossilize::FeatureFilter::Impl::subpass_description_is_supported
          (Impl *this,VkSubpassDescription *sub)

{
  bool bVar1;
  ulong uVar2;
  
  bVar1 = subpass_description_flags_is_supported(this,sub->flags);
  if (bVar1) {
    if (sub->colorAttachmentCount != 0) {
      uVar2 = 0;
      do {
        bVar1 = image_layout_is_supported(this,sub->pColorAttachments[uVar2].layout);
        if (!bVar1) goto LAB_00110e72;
        if (sub->pResolveAttachments != (VkAttachmentReference *)0x0) {
          bVar1 = image_layout_is_supported(this,sub->pResolveAttachments[uVar2].layout);
          if (!bVar1) goto LAB_00110e72;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < sub->colorAttachmentCount);
    }
    if (sub->inputAttachmentCount != 0) {
      uVar2 = 0;
      do {
        bVar1 = image_layout_is_supported(this,sub->pInputAttachments[uVar2].layout);
        if (!bVar1) goto LAB_00110e72;
        uVar2 = uVar2 + 1;
      } while (uVar2 < sub->inputAttachmentCount);
    }
    if (sub->pDepthStencilAttachment != (VkAttachmentReference *)0x0) {
      bVar1 = image_layout_is_supported(this,sub->pDepthStencilAttachment->layout);
      if (!bVar1) goto LAB_00110e72;
    }
    bVar1 = true;
  }
  else {
LAB_00110e72:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FeatureFilter::Impl::subpass_description_is_supported(const VkSubpassDescription &sub) const
{
	if (!subpass_description_flags_is_supported(sub.flags))
		return false;

	for (uint32_t j = 0; j < sub.colorAttachmentCount; j++)
	{
		if (!attachment_reference_is_supported(sub.pColorAttachments[j]))
			return false;
		if (sub.pResolveAttachments && !attachment_reference_is_supported(sub.pResolveAttachments[j]))
			return false;
	}

	for (uint32_t j = 0; j < sub.inputAttachmentCount; j++)
		if (!attachment_reference_is_supported(sub.pInputAttachments[j]))
			return false;

	if (sub.pDepthStencilAttachment && !attachment_reference_is_supported(*sub.pDepthStencilAttachment))
		return false;

	return true;
}